

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O2

wostream * Centaurus::operator<<(wostream *os,ATNPath *path)

{
  uint uVar1;
  wostream *pwVar2;
  pointer ppVar3;
  pointer ppVar4;
  ulong uVar5;
  
  ppVar3 = (path->
           super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
           ).
           super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar4 = (path->
           super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
           ).
           super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar3 != ppVar4) {
    for (uVar1 = 0; uVar5 = (ulong)uVar1, uVar5 < ((long)ppVar4 - (long)ppVar3) / 0x30 - 1U;
        uVar1 = uVar1 + 1) {
      pwVar2 = std::operator<<(os,(wstring *)&ppVar3[uVar5].first.m_id);
      pwVar2 = std::operator<<(pwVar2,L'.');
      pwVar2 = (wostream *)
               std::wostream::operator<<
                         ((wostream *)pwVar2,
                          (path->
                          super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                          ).
                          super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar5].second);
      std::operator<<(pwVar2,L'/');
      ppVar3 = (path->
               super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
               ).
               super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ppVar4 = (path->
               super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
               ).
               super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    pwVar2 = std::operator<<(os,(wstring *)&ppVar4[-1].first.m_id);
    pwVar2 = std::operator<<(pwVar2,L'.');
    std::wostream::operator<<
              ((wostream *)pwVar2,
               (path->
               super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
               ).
               super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1].second);
  }
  return os;
}

Assistant:

std::wostream& operator<<(std::wostream& os, const ATNPath& path)
{
	if (!path.empty())
	{
		for (unsigned int i = 0; i < path.size() - 1; i++)
		{
			os << path[i].first << L'.' << path[i].second << L'/';
		}
		os << path.back().first << L'.' << path.back().second;
	}
	return os;
}